

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keymap.c
# Opt level: O1

void load_keymap(void)

{
  int iVar1;
  wchar_t wVar2;
  nh_cmd_desc *pnVar3;
  wchar_t wVar4;
  nh_bool nVar5;
  int iVar6;
  uint uVar7;
  void *__src;
  long lVar8;
  size_t sVar9;
  __off_t _Var10;
  char *__s;
  byte *pbVar11;
  ushort **ppuVar12;
  ulong uVar13;
  nh_cmd_desc *pnVar14;
  long lVar15;
  byte bVar16;
  bool bVar17;
  bool bVar18;
  fnchar filename [256];
  byte *local_140;
  char local_138 [8];
  undefined4 auStack_130 [64];
  
  __src = (void *)nh_get_commands(&cmdcount);
  lVar8 = (long)cmdcount;
  commandlist = (nh_cmd_desc *)malloc(lVar8 * 0x6c);
  memcpy(commandlist,__src,lVar8 * 0x6c);
  init_keymap();
  local_138[0] = '\0';
  nVar5 = get_gamedir(CONFIG_DIR,local_138);
  if (nVar5 != '\0') {
    sVar9 = strlen(local_138);
    builtin_strncpy(local_138 + sVar9,"keymap.c",8);
    *(undefined4 *)((long)auStack_130 + sVar9) = 0x666e6f;
    iVar6 = open(local_138,0,0);
    if (iVar6 != -1) {
      _Var10 = lseek(iVar6,0,2);
      lseek(iVar6,0,0);
      iVar1 = (int)_Var10;
      __s = (char *)malloc((long)(iVar1 + 1));
      read(iVar6,__s,(long)iVar1);
      __s[iVar1] = '\0';
      close(iVar6);
      unknown_count = L'\0';
      memset(unknown_keymap,0,0xff8);
      pbVar11 = (byte *)strtok(__s,"\r\n");
      while (pbVar11 != (byte *)0x0) {
        bVar16 = *pbVar11;
        if (bVar16 == 0) {
          uVar13 = 0;
        }
        else {
          ppuVar12 = __ctype_b_loc();
          uVar13 = 0;
          do {
            if ((*(byte *)((long)*ppuVar12 + (ulong)bVar16 * 2 + 1) & 0x20) != 0) break;
            bVar16 = pbVar11[uVar13 + 1];
            uVar13 = uVar13 + 1;
          } while (bVar16 != 0);
          uVar13 = uVar13 & 0xffffffff;
        }
        bVar16 = pbVar11[uVar13];
        if (bVar16 == 0) {
          bVar17 = false;
        }
        else {
          ppuVar12 = __ctype_b_loc();
          do {
            if ((*(byte *)((long)*ppuVar12 + (ulong)bVar16 * 2 + 1) & 0x20) == 0) break;
            bVar16 = pbVar11[uVar13 + 1];
            uVar13 = uVar13 + 1;
          } while (bVar16 != 0);
          bVar17 = bVar16 == 0x2d;
        }
        pnVar14 = find_command((char *)(pbVar11 + uVar13));
        wVar4 = unknown_count;
        pnVar3 = unknown_commands;
        bVar18 = pnVar14 == (nh_cmd_desc *)0x0;
        if (bVar18 && !bVar17) {
          lVar8 = (long)unknown_count;
          if (unknown_size <= unknown_count) {
            wVar2 = unknown_size * 2;
            if (unknown_size * 2 < L'\x11') {
              wVar2 = L'\x10';
            }
            unknown_size = wVar2;
            pnVar14 = (nh_cmd_desc *)realloc(unknown_commands,(ulong)(uint)wVar2 * 0x6c);
            unknown_commands = pnVar14;
            memset(pnVar14 + lVar8,0,(long)(wVar2 - wVar4) * 0x6c);
            lVar15 = 0;
            do {
              if (*(long *)((long)unknown_keymap + lVar15) != 0) {
                *(long *)((long)unknown_keymap + lVar15) =
                     (long)pnVar14 + (*(long *)((long)unknown_keymap + lVar15) - (long)pnVar3);
              }
              lVar15 = lVar15 + 8;
            } while (lVar15 != 0xff8);
          }
          pnVar3 = unknown_commands;
          unknown_count = wVar4 + L'\x01';
          pnVar14 = unknown_commands + lVar8;
          strncpy(pnVar14->name,(char *)(pbVar11 + uVar13),0x14);
          pnVar3[lVar8].name[0x13] = '\0';
        }
        if (pnVar14 != (nh_cmd_desc *)0x0) {
          iVar6 = strncmp((char *)pbVar11,"EXT",3);
          if (iVar6 == 0) {
            pbVar11 = (byte *)((long)&pnVar14->flags + 1);
            *pbVar11 = *pbVar11 | 4;
          }
          else {
            iVar6 = strncmp((char *)pbVar11,"NOEXT",5);
            if (iVar6 == 0) {
              pbVar11 = (byte *)((long)&pnVar14->flags + 1);
              *pbVar11 = *pbVar11 & 0xfb;
            }
            else {
              lVar8 = strtol((char *)pbVar11,(char **)&local_140,0x10);
              uVar7 = (uint)lVar8;
              if ((uVar7 == 0) || (local_140 == pbVar11)) {
                curses_msgwin("Bad/damaged keymap.conf. Reverting to defaults.");
                init_keymap();
                return;
              }
              if (uVar7 < 0x1ff) {
                if (bVar18 && !bVar17) {
                  unknown_keymap[uVar7 & 0x1ff] = pnVar14;
                }
                else {
                  keymap[uVar7 & 0x1ff] = pnVar14;
                }
              }
            }
          }
        }
        pbVar11 = (byte *)strtok((char *)0x0,"\r\n");
      }
      free(__s);
    }
  }
  return;
}

Assistant:

void load_keymap(void)
{
    struct nh_cmd_desc *cmdlist = nh_get_commands(&cmdcount);
    
    commandlist = malloc(cmdcount * sizeof(struct nh_cmd_desc));
    memcpy(commandlist, cmdlist, cmdcount * sizeof(struct nh_cmd_desc));

    /* always init the keymap - read keymap might not set up every mapping */
    init_keymap();
    read_keymap();
}